

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::quadratic_cost_type
          (quadratic_cost_type<float> *this,objective_function *obj_,int n)

{
  int iVar1;
  pointer poVar2;
  pointer poVar3;
  ulong uVar4;
  float *__s;
  quad *__s_00;
  int *__s_01;
  index *piVar5;
  undefined8 extraout_RAX;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  index *piVar11;
  ulong uVar12;
  ulong uVar13;
  
  this->obj = obj_;
  uVar12 = (long)n * 4;
  if (n < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  __s = (float *)operator_new__(uVar12);
  memset(__s,0,uVar12);
  (this->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = __s;
  uVar12 = (long)(obj_->qelements).
                 super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(obj_->qelements).
                 super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = uVar12 | 8;
  if ((long)uVar12 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  __s_00 = (quad *)operator_new__(uVar13);
  memset(__s_00,0,uVar13);
  (this->quadratic_elements)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>._M_head_impl =
       __s_00;
  uVar12 = (long)n * 4 + 4;
  if (n < -1) {
    uVar12 = 0xffffffffffffffff;
  }
  __s_01 = (int *)operator_new__(uVar12);
  memset(__s_01,0,uVar12);
  (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = __s_01;
  poVar2 = (obj_->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (long)(obj_->elements).
                 super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)poVar2;
  if ((uVar12 & 0xffffffff0) != 0) {
    uVar12 = uVar12 >> 4 & 0xffffffff;
    piVar5 = &poVar2->variable_index;
    do {
      lVar6 = (long)*piVar5;
      if ((lVar6 < 0) || (n <= *piVar5)) {
LAB_00154121:
        itm::quadratic_cost_type();
        operator_delete__(__s_00);
        _DAT_1000000000 = 0;
        if (_DAT_ffffffff8 != (void *)0x0) {
          operator_delete__(_DAT_ffffffff8);
        }
        _DAT_ffffffff8 = (void *)0x0;
        _Unwind_Resume(extraout_RAX);
      }
      __s[lVar6] = (float)((objective_function_element *)(piVar5 + -2))->factor + __s[lVar6];
      piVar5 = piVar5 + 4;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  *__s_01 = 0;
  if (n != 0) {
    poVar3 = (obj_->qelements).
             super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (long)(obj_->qelements).
                   super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)poVar3;
    uVar12 = 0;
    do {
      uVar9 = uVar12 + 1;
      (__s_01 + 1)[uVar12] = __s_01[uVar12];
      uVar10 = uVar13 >> 4 & 0xffffffff;
      piVar5 = &poVar3->variable_index_b;
      uVar4 = uVar13 & 0xffffffff0;
      while (uVar4 != 0) {
        iVar8 = piVar5[-1];
        if (((long)iVar8 < 0) || (n <= iVar8)) {
          itm::quadratic_cost_type();
LAB_0015411c:
          itm::quadratic_cost_type();
          goto LAB_00154121;
        }
        iVar7 = *piVar5;
        if (((long)iVar7 < 0) || (n <= iVar7)) goto LAB_0015411c;
        if (uVar12 == (long)iVar8 || uVar12 == (long)iVar7) {
          __s_01[uVar9] = __s_01[uVar9] + 1;
        }
        piVar5 = piVar5 + 4;
        uVar10 = uVar10 - 1;
        uVar4 = uVar10;
      }
      uVar12 = uVar9;
    } while (uVar9 != (uint)n);
    poVar3 = (obj_->qelements).
             super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (long)(obj_->qelements).
                   super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)poVar3;
    iVar7 = 0;
    iVar8 = 0;
    do {
      uVar13 = uVar12 >> 4 & 0xffffffff;
      piVar5 = &poVar3->variable_index_b;
      uVar10 = uVar12 & 0xffffffff0;
      while (uVar10 != 0) {
        iVar1 = piVar5[-1];
        if ((iVar1 == iVar7) || (*piVar5 == iVar7)) {
          __s_00[iVar8].factor = (float)((objective_quadratic_element *)(piVar5 + -3))->factor;
          piVar11 = piVar5 + -1;
          if (iVar1 == iVar7) {
            piVar11 = piVar5;
          }
          __s_00[iVar8].id = *piVar11;
          iVar8 = iVar8 + 1;
        }
        piVar5 = piVar5 + 4;
        uVar13 = uVar13 - 1;
        uVar10 = uVar13;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != n);
  }
  return;
}

Assistant:

quadratic_cost_type(const objective_function& obj_, int n)
      : obj(obj_)
      , linear_elements(std::make_unique<Float[]>(n))
      , quadratic_elements(
          std::make_unique<quad[]>(2 * obj.qelements.size() + 1))
      , indices(std::make_unique<int[]>(n + 1))
    {
        for (int i = 0, e = length(obj.elements); i != e; ++i) {
            bx_ensures(0 <= obj.elements[i].variable_index &&
                       obj.elements[i].variable_index < n);

            linear_elements[obj.elements[i].variable_index] +=
              static_cast<Float>(obj.elements[i].factor);
        }

        indices[0] = 0;
        for (int var = 0; var != n; ++var) {
            indices[var + 1] = indices[var];

            for (int i = 0, e = length(obj.qelements); i != e; ++i) {
                bx_ensures(0 <= obj.qelements[i].variable_index_a &&
                           obj.qelements[i].variable_index_a < n);
                bx_ensures(0 <= obj.qelements[i].variable_index_b &&
                           obj.qelements[i].variable_index_b < n);

                if (var == obj.qelements[i].variable_index_a ||
                    var == obj.qelements[i].variable_index_b)
                    ++indices[var + 1];
            }
        }

        for (int id = 0, var = 0; var != n; ++var) {
            for (int i = 0, e = length(obj.qelements); i != e; ++i) {
                const bool is_a = obj.qelements[i].variable_index_a == var;
                const bool is_b = obj.qelements[i].variable_index_b == var;

                if (is_a || is_b) {
                    quadratic_elements[id].factor =
                      static_cast<Float>(obj.qelements[i].factor);
                    quadratic_elements[id].id =
                      is_a ? obj.qelements[i].variable_index_b
                           : obj.qelements[i].variable_index_a;
                    ++id;
                }
            }
        }
    }